

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void __thiscall ghc::filesystem::path::path(path *this,string_type *source,format fmt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  
  paVar1 = &(this->_path).field_2;
  (this->_path)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (source->_M_dataplus)._M_p;
  paVar2 = &source->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&source->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_path).field_2 + 8) = uVar6;
  }
  else {
    (this->_path)._M_dataplus._M_p = pcVar3;
    (this->_path).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_path)._M_string_length = source->_M_string_length;
  (source->_M_dataplus)._M_p = (pointer)paVar2;
  source->_M_string_length = 0;
  (source->field_2)._M_local_buf[0] = '\0';
  pcVar4 = (this->_path)._M_dataplus._M_p;
  uVar5 = (this->_path)._M_string_length;
  if ((((uVar5 < 3) || (*pcVar4 != '/')) || (pcVar4[1] != '/')) || (pcVar4[2] == '/')) {
    _Var7 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (pcVar4,pcVar4 + uVar5);
  }
  else {
    _Var7 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      (pcVar4 + 2,pcVar4 + uVar5);
  }
  (this->_path)._M_string_length = (long)_Var7._M_current - (long)(this->_path)._M_dataplus._M_p;
  *_Var7._M_current = '\0';
  return;
}

Assistant:

GHC_INLINE path::path(string_type&& source, format fmt)
    : _path(std::move(source))
{
    postprocess_path_with_format(fmt);
}